

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Vector<kj::CompressionParameters> *
kj::_::findValidExtensionOffers
          (Vector<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  CompressionParameters *pCVar4;
  ArrayPtr<const_char> *pAVar5;
  undefined2 uVar6;
  size_t newSize;
  ArrayPtr<const_char> *pAVar7;
  long in_R8;
  undefined1 uVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 unaff_R12;
  ushort uVar9;
  undefined8 unaff_R13;
  ArrayPtr<const_char> *pAVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  Vector<kj::CompressionParameters> result;
  Vector<kj::ArrayPtr<const_char>_> extensions;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  undefined1 local_e8 [16];
  CompressionParameters *local_d8;
  ArrayDisposer *pAStack_d0;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_c0;
  undefined1 local_b8 [16];
  ArrayPtr<const_char> *local_a8;
  ArrayDisposer *local_a0;
  undefined1 local_98 [16];
  ArrayPtr<const_char> *local_88;
  ArrayDisposer *local_80;
  Vector<kj::CompressionParameters> *local_70;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_68;
  Maybe<kj::CompressionParameters> local_60;
  
  local_e8 = (undefined1  [16])0x0;
  local_d8 = (CompressionParameters *)0x0;
  pAStack_d0 = (ArrayDisposer *)&NullArrayDisposer::instance;
  input.ptr = (char *)(offers.content.size_ - 1);
  input.size_ = 0x2c;
  splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_b8,(_ *)offers.content.ptr,input,(char)in_R8
            );
  uVar2 = local_b8._8_8_;
  pAVar10 = (ArrayPtr<const_char> *)local_b8._0_8_;
  if (local_b8._0_8_ != local_b8._8_8_) {
    local_70 = __return_storage_ptr__;
    do {
      input_00.size_ = 0x3b;
      input_00.ptr = (char *)pAVar10->size_;
      splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_98,(_ *)pAVar10->ptr,input_00,
                 (char)in_R8);
      pAVar7 = (ArrayPtr<const_char> *)local_98._0_8_;
      if (*(size_t *)(local_98._0_8_ + 8) == 0x12) {
        pcVar1 = *(char **)local_98._0_8_;
        auVar12[0] = -(*pcVar1 == 'p');
        auVar12[1] = -(pcVar1[1] == 'e');
        auVar12[2] = -(pcVar1[2] == 'r');
        auVar12[3] = -(pcVar1[3] == 'm');
        auVar12[4] = -(pcVar1[4] == 'e');
        auVar12[5] = -(pcVar1[5] == 's');
        auVar12[6] = -(pcVar1[6] == 's');
        auVar12[7] = -(pcVar1[7] == 'a');
        auVar12[8] = -(pcVar1[8] == 'g');
        auVar12[9] = -(pcVar1[9] == 'e');
        auVar12[10] = -(pcVar1[10] == '-');
        auVar12[0xb] = -(pcVar1[0xb] == 'd');
        auVar12[0xc] = -(pcVar1[0xc] == 'e');
        auVar12[0xd] = -(pcVar1[0xd] == 'f');
        auVar12[0xe] = -(pcVar1[0xe] == 'l');
        auVar12[0xf] = -(pcVar1[0xf] == 'a');
        auVar13[0] = -((char)*(undefined2 *)(pcVar1 + 0x10) == 't');
        auVar13[1] = -((char)((ushort)*(undefined2 *)(pcVar1 + 0x10) >> 8) == 'e');
        auVar13[2] = 0xff;
        auVar13[3] = 0xff;
        auVar13[4] = 0xff;
        auVar13[5] = 0xff;
        auVar13[6] = 0xff;
        auVar13[7] = 0xff;
        auVar13[8] = 0xff;
        auVar13[9] = 0xff;
        auVar13[10] = 0xff;
        auVar13[0xb] = 0xff;
        auVar13[0xc] = 0xff;
        auVar13[0xd] = 0xff;
        auVar13[0xe] = 0xff;
        auVar13[0xf] = 0xff;
        auVar13 = auVar13 & auVar12;
        if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0038e9d5;
        tryExtractParameters(&local_60,(Vector<kj::ArrayPtr<const_char>_> *)local_98,false);
        uVar6 = local_60.ptr.field_1._0_2_;
        local_68 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)unaff_R13;
        if (local_60.ptr.isSet == true) {
          if (local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet == false) {
            local_c0 = unaff_R12;
            if (local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet != false) {
              local_c0 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1;
            }
          }
          else {
            local_c0 = local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.field_1;
            unaff_R13 = local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.field_1;
          }
          bVar11 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet != false;
          local_68 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)unaff_R13;
          if (bVar11) {
            local_68 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1;
          }
          uVar8 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet;
          if (bVar11) {
            uVar8 = '\0';
          }
          if (local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet != false) {
            uVar8 = true;
          }
          if ((CompressionParameters *)local_e8._8_8_ == local_d8) {
            newSize = ((long)(local_e8._8_8_ - local_e8._0_8_) >> 3) * -0x6666666666666666;
            if (local_e8._8_8_ == local_e8._0_8_) {
              newSize = 4;
            }
            Vector<kj::CompressionParameters>::setCapacity
                      ((Vector<kj::CompressionParameters> *)local_e8,newSize);
          }
          uVar9 = uVar6 << 8 | (ushort)uVar6 >> 8;
          ((CompressionParameters *)local_e8._8_8_)->outboundNoContextTakeover = (bool)(char)uVar9;
          ((CompressionParameters *)local_e8._8_8_)->inboundNoContextTakeover =
               (bool)(char)(uVar9 >> 8);
          (((CompressionParameters *)local_e8._8_8_)->outboundMaxWindowBits).ptr.isSet = (bool)uVar8
          ;
          if ((bool)uVar8 != false) {
            (((CompressionParameters *)local_e8._8_8_)->outboundMaxWindowBits).ptr.field_1 =
                 local_c0;
          }
          (((CompressionParameters *)local_e8._8_8_)->inboundMaxWindowBits).ptr.isSet = bVar11;
          if (bVar11) {
            (((CompressionParameters *)local_e8._8_8_)->inboundMaxWindowBits).ptr.field_1 = local_68
            ;
          }
          local_e8._8_8_ = (RemoveConst<kj::CompressionParameters> *)(local_e8._8_8_ + 0x28);
          unaff_R12 = local_c0;
        }
        pAVar7 = (ArrayPtr<const_char> *)local_98._0_8_;
        unaff_R13 = local_68;
        if ((ArrayPtr<const_char> *)local_98._0_8_ != (ArrayPtr<const_char> *)0x0)
        goto LAB_0038e9d5;
      }
      else {
LAB_0038e9d5:
        pAVar5 = local_88;
        uVar3 = local_98._8_8_;
        local_98 = (undefined1  [16])0x0;
        local_88 = (ArrayPtr<const_char> *)0x0;
        in_R8 = (long)pAVar5 - (long)pAVar7 >> 4;
        (**local_80->_vptr_ArrayDisposer)(local_80,pAVar7,0x10,uVar3 - (long)pAVar7 >> 4,in_R8,0);
      }
      pAVar10 = pAVar10 + 1;
    } while (pAVar10 != (ArrayPtr<const_char> *)uVar2);
    __return_storage_ptr__ = local_70;
    pAVar10 = (ArrayPtr<const_char> *)local_b8._0_8_;
  }
  pAVar7 = local_a8;
  uVar2 = local_b8._8_8_;
  (__return_storage_ptr__->builder).ptr = (CompressionParameters *)local_e8._0_8_;
  (__return_storage_ptr__->builder).pos = (RemoveConst<kj::CompressionParameters> *)local_e8._8_8_;
  (__return_storage_ptr__->builder).endPtr = local_d8;
  (__return_storage_ptr__->builder).disposer = pAStack_d0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = (CompressionParameters *)0x0;
  if (pAVar10 != (ArrayPtr<const_char> *)0x0) {
    local_b8 = (undefined1  [16])0x0;
    local_a8 = (ArrayPtr<const_char> *)0x0;
    (**local_a0->_vptr_ArrayDisposer)
              (local_a0,pAVar10,0x10,uVar2 - (long)pAVar10 >> 4,(long)pAVar7 - (long)pAVar10 >> 4,0)
    ;
    pCVar4 = local_d8;
    uVar2 = local_e8._0_8_;
    if ((CompressionParameters *)local_e8._0_8_ != (CompressionParameters *)0x0) {
      uVar3 = local_e8._8_8_;
      local_e8 = (undefined1  [16])0x0;
      local_d8 = (CompressionParameters *)0x0;
      (**pAStack_d0->_vptr_ArrayDisposer)
                (pAStack_d0,uVar2,0x28,((long)(uVar3 - uVar2) >> 3) * -0x3333333333333333,
                 ((long)pCVar4 - uVar2 >> 3) * -0x3333333333333333,
                 ArrayDisposer::Dispose_<kj::CompressionParameters>::destruct);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Vector<CompressionParameters> findValidExtensionOffers(StringPtr offers) {
  // A function to be called by the client that wants to offer extensions through
  // `Sec-WebSocket-Extensions`. This function takes the value of the header (a string) and
  // populates a Vector of all the valid offers.
  kj::Vector<CompressionParameters> result;

  auto extensions = splitParts(offers, ',');

  for (const auto& offer : extensions) {
    auto splitOffer = splitParts(offer, ';');
    if (splitOffer.front() != "permessage-deflate"_kj) {
      continue;
    }
    KJ_IF_SOME(validated, tryExtractParameters(splitOffer, false)) {
      // We need to swap the inbound/outbound properties since `tryExtractParameters` thinks we're
      // parsing as the server (`isAgreement` is false).
      auto tempCtx = validated.inboundNoContextTakeover;
      validated.inboundNoContextTakeover = validated.outboundNoContextTakeover;
      validated.outboundNoContextTakeover = tempCtx;
      auto tempWindow = validated.inboundMaxWindowBits;
      validated.inboundMaxWindowBits = validated.outboundMaxWindowBits;
      validated.outboundMaxWindowBits = tempWindow;
      result.add(kj::mv(validated));
    }
  }

  return kj::mv(result);
}